

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.hpp
# Opt level: O1

bool __thiscall EOPlus::Parser::GetToken(Parser *this,Token *t,uint allow)

{
  undefined1 local_60 [24];
  _Alloc_hider local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  bool local_28;
  bool bStack_27;
  bool bStack_26;
  bool bStack_25;
  bool bStack_24;
  undefined3 uStack_23;
  var_type local_20;
  int local_18;
  
  Parser_Token_Server_Base::GetToken
            ((Token *)local_60,
             (this->tok)._M_t.
             super___uniq_ptr_impl<EOPlus::Parser_Token_Server_Base,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
             ._M_t.
             super__Tuple_impl<0UL,_EOPlus::Parser_Token_Server_Base_*,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
             .super__Head_base<0UL,_EOPlus::Parser_Token_Server_Base_*,_false>._M_head_impl,allow);
  t->type = local_60._0_4_;
  *(undefined8 *)&t->data = local_60._8_8_;
  (t->data).val_float = (double)local_60._16_8_;
  std::__cxx11::string::operator=((string *)&(t->data).val_string,(string *)&local_48);
  (t->data).val_bool = local_28;
  (t->data).cache_val[0] = bStack_27;
  (t->data).cache_val[1] = bStack_26;
  (t->data).cache_val[2] = bStack_25;
  (t->data).cache_val[3] = bStack_24;
  *(undefined3 *)&(t->data).field_0x35 = uStack_23;
  (t->data).type = local_20;
  t->newlines = local_18;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_p != &local_38) {
    operator_delete(local_48._M_p,local_38._M_allocated_capacity + 1);
  }
  return t->type != Invalid;
}

Assistant:

bool GetToken(Token& t, unsigned int allow = 0xFFFFFFFF)
			{
				t = this->tok->GetToken(allow);
				return bool(t);
			}